

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::convolveTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int *firstIndices,int *secondIndices,int *resultIndices,
          int matrixCount)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  int k;
  float sum;
  int j;
  int i;
  int l;
  int n;
  float *B;
  float *A;
  float *C;
  int u;
  int returnCode;
  int matrixCount_local;
  int *resultIndices_local;
  int *secondIndices_local;
  int *firstIndices_local;
  BeagleCPUImpl<float,_1,_0> *this_local;
  
  u = 0;
  while( true ) {
    if (matrixCount <= u) {
      return 0;
    }
    if ((firstIndices[u] == resultIndices[u]) || (secondIndices[u] == resultIndices[u])) break;
    pfVar1 = this->gTransitionMatrices[resultIndices[u]];
    A = this->gTransitionMatrices[firstIndices[u]];
    B = this->gTransitionMatrices[secondIndices[u]];
    n = 0;
    for (l = 0; l < this->kCategoryCount; l = l + 1) {
      for (i = 0; i < this->kStateCount; i = i + 1) {
        for (j = 0; j < this->kStateCount; j = j + 1) {
          sum = 0.0;
          for (k = 0; k < this->kStateCount; k = k + 1) {
            auVar2 = vfmadd213ss_fma(ZEXT416((uint)B[j + this->kTransPaddedStateCount * k]),
                                     ZEXT416((uint)A[k + this->kTransPaddedStateCount * i]),
                                     ZEXT416((uint)sum));
            sum = auVar2._0_4_;
          }
          pfVar1[n] = sum;
          n = n + 1;
        }
        pfVar1[n] = 1.0;
        n = n + 1;
      }
      A = A + this->kStateCount * this->kTransPaddedStateCount;
      B = B + this->kStateCount * this->kTransPaddedStateCount;
    }
    u = u + 1;
  }
  return -5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::convolveTransitionMatrices(const int* firstIndices,
        const int* secondIndices,
        const int* resultIndices,
        int matrixCount) {

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Entering BeagleCPUImpl::convolveTransitionMatrices \n");
#endif

    int returnCode = BEAGLE_SUCCESS;

    for (int u = 0; u < matrixCount; u++) {

        if(firstIndices[u] == resultIndices[u] || secondIndices[u] == resultIndices[u]) {

#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr, "In-place convolution is not allowed \n");
#endif

            returnCode = BEAGLE_ERROR_OUT_OF_RANGE;
            break;

        }//END: overwrite check

        REALTYPE* C = gTransitionMatrices[resultIndices[u]];
        REALTYPE* A = gTransitionMatrices[firstIndices[u]];
        REALTYPE* B = gTransitionMatrices[secondIndices[u]];

        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {

            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {

                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++) {
                        sum += A[k + kTransPaddedStateCount * i] * B[j + kTransPaddedStateCount * k];
                    }
//                  printf("%.30f %.30f %d: \n", C[n], sum, l);
                    C[n] = sum;
                    n++;

                }//END: j loop

                if (T_PAD != 0) {

                    //                      A[n] = 1.0;
                    //                      B[n] = 1.0;
                    C[n] = 1.0;

                    n += T_PAD;

                }//END: padding check

            }//END: i loop

            A += kStateCount * kTransPaddedStateCount;
            B += kStateCount * kTransPaddedStateCount;

        }//END: rates loop

    }//END: u loop

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Leaving BeagleCPUImpl::convolveTransitionMatrices \n");
#endif

    return returnCode;
}